

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O1

double CETime::TimeSec2Time(double *seconds)

{
  double dVar1;
  double dVar2;
  double __x;
  
  for (__x = *seconds; __x < 0.0; __x = __x + dVar1) {
    dVar1 = CppEphem::sec_per_day();
  }
  dVar1 = floor(__x);
  dVar2 = floor(__x - (double)((int)dVar1 % 0x3c));
  return (double)((int)(dVar2 / 60.0) / 0x3c) * 10000.0 +
         (double)((int)(dVar2 / 60.0) % 0x3c) * 100.0 + (double)((int)dVar1 % 0x3c) + (__x - dVar1);
}

Assistant:

double CETime::TimeSec2Time(const double& seconds)
{
    // Make sure the seconds are positive
    double secs(seconds);
    while (secs < 0.0) {
        secs += CppEphem::sec_per_day();
    }

    // Now do the actual conversion to a vector
    double fracsec = secs - std::floor(secs) ;          // Fractions of a second
    double sec = int(std::floor(secs)) % 60 ;           // Whole seconds
    double min = int(std::floor(secs-sec)/60) % 60 ;    // Whole minutes
    double hrs = int(std::floor(secs-sec)/60)/60 ;      // Whole hours
    return (hrs*10000) + (min*100) + sec + fracsec ;    // Formatted double (HHMMSS.S)
}